

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsoncpp.cpp
# Opt level: O0

vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_> *
__thiscall
Json::OurReader::getStructuredErrors
          (vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
           *__return_storage_ptr__,OurReader *this)

{
  bool bVar1;
  undefined1 local_98 [8];
  StructuredError structured;
  ErrorInfo *error;
  undefined1 local_40 [8];
  const_iterator itError;
  OurReader *this_local;
  vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
  *allErrors;
  
  itError._M_node._7_1_ = 0;
  std::vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>::
  vector(__return_storage_ptr__);
  std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::begin
            ((const_iterator *)local_40,&this->errors_);
  while( true ) {
    std::deque<Json::OurReader::ErrorInfo,_std::allocator<Json::OurReader::ErrorInfo>_>::end
              ((const_iterator *)&error,&this->errors_);
    bVar1 = std::operator!=((_Self *)local_40,(_Self *)&error);
    if (!bVar1) break;
    structured.message.field_2._8_8_ =
         std::
         _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
         ::operator*((_Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
                      *)local_40);
    StructuredError::StructuredError((StructuredError *)local_98);
    local_98 = (undefined1  [8])
               (*(long *)(structured.message.field_2._8_8_ + 8) - (long)this->begin_);
    structured.offset_start =
         *(long *)(structured.message.field_2._8_8_ + 0x10) - (long)this->begin_;
    std::__cxx11::string::operator=
              ((string *)&structured.offset_limit,
               (string *)(structured.message.field_2._8_8_ + 0x18));
    std::vector<Json::OurReader::StructuredError,_std::allocator<Json::OurReader::StructuredError>_>
    ::push_back(__return_storage_ptr__,(value_type *)local_98);
    StructuredError::~StructuredError((StructuredError *)local_98);
    std::
    _Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
    ::operator++((_Deque_iterator<Json::OurReader::ErrorInfo,_const_Json::OurReader::ErrorInfo_&,_const_Json::OurReader::ErrorInfo_*>
                  *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<OurReader::StructuredError> OurReader::getStructuredErrors() const {
  std::vector<OurReader::StructuredError> allErrors;
  for (Errors::const_iterator itError = errors_.begin();
       itError != errors_.end();
       ++itError) {
    const ErrorInfo& error = *itError;
    OurReader::StructuredError structured;
    structured.offset_start = error.token_.start_ - begin_;
    structured.offset_limit = error.token_.end_ - begin_;
    structured.message = error.message_;
    allErrors.push_back(structured);
  }
  return allErrors;
}